

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O1

wstring * __thiscall ZXing::Content::utfW_abi_cxx11_(wstring *__return_storage_ptr__,Content *this)

{
  char *in_RCX;
  string_view utf8;
  string local_30;
  
  render_abi_cxx11_(&local_30,this,false);
  utf8._M_str = in_RCX;
  utf8._M_len = (size_t)local_30._M_dataplus._M_p;
  FromUtf8_abi_cxx11_(__return_storage_ptr__,(ZXing *)local_30._M_string_length,utf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Content::utfW() const
{
	return FromUtf8(render(false));
}